

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O1

int parse_attr_token(char *str,char *attr_name,char **val,size_t *vallen)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  size_t len;
  char *pcVar4;
  void *pvVar5;
  char *pcVar6;
  
  *val = (char *)0x0;
  *vallen = 0;
  len = strlen(attr_name);
  for (pcVar4 = strchr(str,0x3b); bVar2 = pcVar4 != (char *)0x0, bVar2; pcVar4 = strchr(pcVar4,0x3b)
      ) {
    do {
      pcVar6 = pcVar4 + 1;
      pcVar4 = pcVar4 + 1;
      iVar3 = isspace((int)*pcVar6);
    } while (iVar3 != 0);
    iVar3 = memicmp(pcVar4,attr_name,len);
    if (iVar3 == 0) {
      pcVar6 = pcVar4 + len;
      do {
        pcVar4 = pcVar6;
        cVar1 = *pcVar4;
        iVar3 = isspace((int)cVar1);
        pcVar6 = pcVar4 + 1;
      } while (iVar3 != 0);
      if (cVar1 == '=') goto LAB_00207d94;
    }
  }
LAB_00207dfe:
  return (uint)bVar2;
LAB_00207d94:
  do {
    pcVar4 = pcVar6;
    cVar1 = *pcVar4;
    iVar3 = isspace((int)cVar1);
    pcVar6 = pcVar4 + 1;
  } while (iVar3 != 0);
  if (cVar1 == '\"') {
    *val = pcVar6;
    for (; (*pcVar6 != '\0' && (*pcVar6 != '\"')); pcVar6 = pcVar6 + 1) {
    }
  }
  else {
    *val = pcVar4;
    cVar1 = *pcVar4;
    pcVar6 = pcVar4;
    while ((cVar1 != '\0' && (pvVar5 = memchr(" \t;,",(int)cVar1,5), pvVar5 == (void *)0x0))) {
      cVar1 = pcVar6[1];
      pcVar6 = pcVar6 + 1;
    }
  }
  *vallen = (long)pcVar6 - (long)*val;
  goto LAB_00207dfe;
}

Assistant:

static int parse_attr_token(const char *str, const char *attr_name,
                            const char *&val, size_t &vallen)
{
    /* assume we won't find anything */
    val = 0;
    vallen = 0;

    /* note the name length */
    size_t attr_name_len = strlen(attr_name);

    /* scan the string for attribute tokens, starting at the first ';' */
    for (const char *p = strchr(str, ';') ; p != 0 ; p = strchr(p, ';'))
    {
        /* skip spaces */
        for (++p ; isspace(*p) ; ++p) ;

        /* check to see if this is the desired attribute name */
        if (memicmp(p, attr_name, attr_name_len) != 0)
            continue;

        /* skip the name and any subsequent spaces, and look for the '=' */
        for (p += attr_name_len ; isspace(*p) ; ++p) ;
        if (*p != '=')
            continue;

        /* skip the '=' and subsequent spaces */
        for (++p ; isspace(*p) ; ++p) ;

        /* 
         *   Okay, we're at the attribute value.  If there's a quote mark,
         *   the value is everything from here to the close quote.  Otherwise
         *   it's everything up to the next space or semicolon.  
         */
        if (*p == '"')
        {
            /* skip the open quote, and find the close quote */
            for (val = ++p ; *p != '\0' && *p != '"' ; ++p) ;
        }
        else
        {
            /* it's from here to the next separator character */
            val = p;
            for ( ; *p != '\0' && strchr(" \t;,", *p) == 0 ; ++p) ;
        }

        /* note the length, and return success */
        vallen = p - val;
        return TRUE;
    }

    /* didn't find it - return failure */
    return FALSE;
}